

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettywriter.h
# Opt level: O0

void __thiscall
rapidjson::
PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::PrettyPrefix(PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
               *this,Type type)

{
  size_t sVar1;
  Level *pLVar2;
  int in_ESI;
  PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *in_RDI;
  Level *level;
  bool local_21;
  Ch c;
  PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_00;
  
  this_00 = in_RDI;
  sVar1 = internal::Stack<rapidjson::CrtAllocator>::GetSize
                    (&(in_RDI->
                      super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                      ).level_stack_);
  if (sVar1 == 0) {
    (in_RDI->
    super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ).hasRoot_ = true;
  }
  else {
    pLVar2 = internal::Stack<rapidjson::CrtAllocator>::
             Top<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>::Level>
                       (&(in_RDI->
                         super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                         ).level_stack_);
    c = (Ch)((uint)in_ESI >> 0x18);
    if ((pLVar2->inArray & 1U) == 0) {
      if (pLVar2->valueCount == 0) {
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                  ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this_00,c)
        ;
      }
      else if ((pLVar2->valueCount & 1) == 0) {
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                  ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this_00,c)
        ;
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                  ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this_00,
                   (Ch)((uint)in_ESI >> 0x18));
      }
      else {
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                  ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this_00,c)
        ;
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                  ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this_00,
                   (Ch)((uint)in_ESI >> 0x18));
      }
      if ((pLVar2->valueCount & 1) == 0) {
        WriteIndent(in_RDI);
      }
    }
    else {
      local_21 = false;
      if (((in_RDI->formatOptions_ & kFormatSingleLineArray) != kFormatDefault) &&
         (local_21 = false, in_ESI != 3)) {
        local_21 = in_ESI != 4;
      }
      pLVar2->inLine = local_21;
      if ((pLVar2->valueCount != 0) &&
         (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                    ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this_00,
                     c), (pLVar2->inLine & 1U) != 0)) {
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                  ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this_00,
                   (Ch)((uint)in_ESI >> 0x18));
      }
      if ((pLVar2->inLine & 1U) == 0) {
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                  ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this_00,
                   (Ch)((uint)in_ESI >> 0x18));
        WriteIndent(in_RDI);
      }
    }
    pLVar2->valueCount = pLVar2->valueCount + 1;
  }
  return;
}

Assistant:

void PrettyPrefix(Type type) {
        (void)type;
        if (Base::level_stack_.GetSize() != 0) { // this value is not at root
            typename Base::Level* level = Base::level_stack_.template Top<typename Base::Level>();

            if (level->inArray) {
                level->inLine = (formatOptions_ & kFormatSingleLineArray) && type != kObjectType && type != kArrayType;

                if (level->valueCount > 0) {
                    Base::os_->Put(','); // add comma if it is not the first element in array
                    if (level->inLine) {
                        Base::os_->Put(' ');
                    }
                }

                if (!level->inLine) {
                    Base::os_->Put('\n');
                    WriteIndent();
                }
            }
            else {  // in object
                if (level->valueCount > 0) {
                    if (level->valueCount % 2 == 0) {
                        Base::os_->Put(',');
                        Base::os_->Put('\n');
                    }
                    else {
                        Base::os_->Put(':');
                        Base::os_->Put(' ');
                    }
                }
                else
                    Base::os_->Put('\n');

                if (level->valueCount % 2 == 0)
                    WriteIndent();
            }
            if (!level->inArray && level->valueCount % 2 == 0)
                RAPIDJSON_ASSERT(type == kStringType);  // if it's in object, then even number should be a name
            level->valueCount++;
        }
        else {
            RAPIDJSON_ASSERT(!Base::hasRoot_);  // Should only has one and only one root.
            Base::hasRoot_ = true;
        }
    }